

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestCase::ClearResult(TestCase *this)

{
  pointer ppTVar1;
  TestInfo *pTVar2;
  pointer ppTVar3;
  
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::_M_erase_at_end
            (&(this->ad_hoc_test_result_).test_part_results_,
             (this->ad_hoc_test_result_).test_part_results_.
             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
             _M_impl.super__Vector_impl_data._M_start);
  std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::_M_erase_at_end
            (&(this->ad_hoc_test_result_).test_properties_,
             (this->ad_hoc_test_result_).test_properties_.
             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (this->ad_hoc_test_result_).death_test_count_ = 0;
  (this->ad_hoc_test_result_).elapsed_time_ = 0;
  ppTVar1 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar3 = (this->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar1; ppTVar3 = ppTVar3 + 1
      ) {
    pTVar2 = *ppTVar3;
    std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::_M_erase_at_end
              (&(pTVar2->result_).test_part_results_,
               (pTVar2->result_).test_part_results_.
               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::_M_erase_at_end
              (&(pTVar2->result_).test_properties_,
               (pTVar2->result_).test_properties_.
               super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>.
               _M_impl.super__Vector_impl_data._M_start);
    (pTVar2->result_).death_test_count_ = 0;
    (pTVar2->result_).elapsed_time_ = 0;
  }
  return;
}

Assistant:

void TestCase::ClearResult() {
  ad_hoc_test_result_.Clear();
  ForEach(test_info_list_, TestInfo::ClearTestResult);
}